

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O1

int uv_udp_set_broadcast(uv_udp_t *handle,int on)

{
  int iVar1;
  int *piVar2;
  undefined1 local_4 [4];
  
  iVar1 = setsockopt((handle->io_watcher).fd,1,6,local_4,4);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    piVar2 = __errno_location();
    iVar1 = -*piVar2;
  }
  return iVar1;
}

Assistant:

int uv_udp_set_broadcast(uv_udp_t* handle, int on) {
  if (setsockopt(handle->io_watcher.fd,
                 SOL_SOCKET,
                 SO_BROADCAST,
                 &on,
                 sizeof(on))) {
    return -errno;
  }

  return 0;
}